

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O3

Data * DL::Expressions::anonymous_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pDVar2;
  vector_t<Data> *pvVar3;
  Data *data;
  pointer data_00;
  DataGroup grp;
  Data d;
  string_t local_b8;
  DataGroup local_98;
  Data local_88;
  
  union_func(&local_88,args,vm);
  if (local_88.mType == DT_Group) {
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    DataGroup::DataGroup(&local_98,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_88.mType != DT_Group) {
      __assert_fail("(mType == DT_Group)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/Data.inl"
                    ,0x41,"DataGroup &DL::Data::getGroup()");
    }
    pvVar3 = DataGroup::getAnonymousEntries(&local_88.mGroup);
    data_00 = (pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pDVar2 = (pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (data_00 != pDVar2) {
      do {
        DataGroup::add(&local_98,data_00);
        data_00 = data_00 + 1;
      } while (data_00 != pDVar2);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    Data::Data(__return_storage_ptr__,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    __return_storage_ptr__->mType = DT_Group;
    DataGroup::operator=(&__return_storage_ptr__->mGroup,&local_98);
    DataGroup::~DataGroup(&local_98);
  }
  else {
    (__return_storage_ptr__->mKey)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mKey).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88.mKey._M_dataplus._M_p,
               local_88.mKey._M_dataplus._M_p + local_88.mKey._M_string_length);
    *(ulong *)&__return_storage_ptr__->mType = CONCAT44(local_88._36_4_,local_88.mType);
    __return_storage_ptr__->field_2 = local_88.field_2;
    DataGroup::DataGroup(&__return_storage_ptr__->mGroup,&local_88.mGroup);
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mString,local_88.mString._M_dataplus._M_p,
               local_88.mString._M_dataplus._M_p + local_88.mString._M_string_length);
  }
  Data::~Data(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Data anonymous_func(const vector_t<Data>& args, VM& vm)
{
	Data d = union_func(args, vm);

	if (d.type() == DT_Group) {
		DataGroup grp;
		for (const Data& data : d.getGroup().getAnonymousEntries())
			grp.add(data);

		Data r;
		r.setGroup(grp);
		return r;
	}

	return d;
}